

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[47],char_const*,char[15],char[24],unsigned_int,char[48]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [47],char **RestArgs,char (*RestArgs_1) [15],char (*RestArgs_2) [24]
               ,uint *RestArgs_3,char (*RestArgs_4) [48])

{
  uint *RestArgs_local_3;
  char (*RestArgs_local_2) [24];
  char (*RestArgs_local_1) [15];
  char **RestArgs_local;
  char (*FirstArg_local) [47];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[47]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[15],char[24],unsigned_int,char[48]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}